

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

bool __thiscall Query::operator==(Query *this,Query *other)

{
  bool bVar1;
  int *in_RSI;
  vector<QToken,_std::allocator<QToken>_> *in_RDI;
  vector<QToken,_std::allocator<QToken>_> *unaff_retaddr;
  bool local_11;
  
  local_11 = false;
  if (*(int *)&(in_RDI->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
               super__Vector_impl_data._M_start == *in_RSI) {
    bVar1 = std::operator==(unaff_retaddr,in_RDI);
    local_11 = false;
    if (bVar1) {
      local_11 = std::operator==((vector<Query,_std::allocator<Query>_> *)unaff_retaddr,
                                 (vector<Query,_std::allocator<Query>_> *)in_RDI);
    }
  }
  return local_11;
}

Assistant:

bool Query::operator==(const Query &other) const {
    return type == other.type && value == other.value &&
           queries == other.queries;
}